

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O1

void __thiscall
sglr::GLContext::genVertexArrays(GLContext *this,int numArrays,deUint32 *vertexArrays)

{
  long lVar1;
  _Alloc_node __an;
  _Alloc_node local_38;
  
  glu::CallLogWrapper::glGenVertexArrays(this->m_wrapper,numArrays,vertexArrays);
  if (0 < numArrays) {
    lVar1 = (ulong)(uint)numArrays << 2;
    local_38._M_t = &(this->m_allocatedVaos)._M_t;
    do {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::
      _M_insert_unique_<unsigned_int&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&this->m_allocatedVaos,
                 (const_iterator)&(this->m_allocatedVaos)._M_t._M_impl.super__Rb_tree_header,
                 vertexArrays,&local_38);
      vertexArrays = vertexArrays + 1;
      lVar1 = lVar1 + -4;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void GLContext::genVertexArrays (int numArrays, deUint32* vertexArrays)
{
	m_wrapper->glGenVertexArrays(numArrays, vertexArrays);
	if (numArrays > 0)
		m_allocatedVaos.insert(vertexArrays, vertexArrays+numArrays);
}